

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupToLevel(int remaining,bool apply_focus_to_window_under)

{
  int *piVar1;
  int iVar2;
  ImGuiPopupRef *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow **ppIVar5;
  ImGuiPopupRef *__dest;
  ImGuiWindow *window;
  ImGuiContext *ctx;
  int iVar6;
  
  pIVar4 = GImGui;
  pIVar3 = (GImGui->OpenPopupStack).Data;
  ppIVar5 = &pIVar3[(ulong)(uint)remaining - 1].Window;
  if (remaining < 1) {
    ppIVar5 = &pIVar3->ParentWindow;
  }
  window = *ppIVar5;
  iVar2 = (GImGui->OpenPopupStack).Capacity;
  if (iVar2 < remaining) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar6 <= remaining) {
      iVar6 = remaining;
    }
    if (iVar2 < iVar6) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)((long)iVar6 * 0x30,GImAllocatorUserData);
      pIVar3 = (pIVar4->OpenPopupStack).Data;
      if (pIVar3 != (ImGuiPopupRef *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar4->OpenPopupStack).Size * 0x30);
        pIVar3 = (pIVar4->OpenPopupStack).Data;
        if ((pIVar3 != (ImGuiPopupRef *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (pIVar4->OpenPopupStack).Data = __dest;
      (pIVar4->OpenPopupStack).Capacity = iVar6;
    }
  }
  (pIVar4->OpenPopupStack).Size = remaining;
  if (apply_focus_to_window_under) {
    if ((pIVar4->NavLayer == ImGuiNavLayer_Main) &&
       (window->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      window = window->NavLastChildNavWindow;
    }
    FocusWindow(window);
    return;
  }
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool apply_focus_to_window_under)
{
    IM_ASSERT(remaining >= 0);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* focus_window = (remaining > 0) ? g.OpenPopupStack[remaining-1].Window : g.OpenPopupStack[0].ParentWindow;
    g.OpenPopupStack.resize(remaining);

    // FIXME: This code is faulty and we may want to eventually to replace or remove the 'apply_focus_to_window_under=true' path completely.
    // Instead of using g.OpenPopupStack[remaining-1].Window etc. we should find the highest root window that is behind the popups we are closing.
    // The current code will set focus to the parent of the popup window which is incorrect. 
    // It rarely manifested until now because UpdateMouseMovingWindow() would call FocusWindow() again on the clicked window, 
    // leading to a chain of focusing A (clicked window) then B (parent window of the popup) then A again.
    // However if the clicked window has the _NoMove flag set we would be left with B focused.
    // For now, we have disabled this path when called from ClosePopupsOverWindow() because the users of ClosePopupsOverWindow() don't need to alter focus anyway,
    // but we should inspect and fix this properly.
    if (apply_focus_to_window_under)
    {
        if (g.NavLayer == 0)
            focus_window = NavRestoreLastChildNavWindow(focus_window);
        FocusWindow(focus_window);
    }
}